

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::emit_write_sampler_feedback_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  uint32_t size;
  mapped_type *pmVar1;
  bool bVar2;
  Id IVar3;
  Id IVar4;
  Id component;
  Id component_00;
  Id component_01;
  Id type_id;
  Id type1;
  Id type_id_00;
  Id IVar5;
  Id IVar6;
  Id IVar7;
  Id IVar8;
  Id IVar9;
  Op OVar10;
  Id IVar11;
  uint uVar12;
  Id IVar13;
  Id IVar14;
  int iVar15;
  Builder *this;
  Value *pVVar16;
  Operation *pOVar17;
  Operation *pOVar18;
  Builder *pBVar19;
  Operation *pOVar20;
  Operation *pOVar21;
  Operation *pOVar22;
  bool bVar23;
  uint32_t i;
  long lVar24;
  Id *pIVar25;
  Id local_dc;
  Id local_78;
  Id ddx [2];
  uint32_t num_coords_full;
  Id feedback_id;
  Id local_50 [2];
  mapped_type *local_48;
  Id coord_ids [2];
  uint32_t num_coords;
  
  this = Converter::Impl::builder(impl);
  spv::Builder::addCapability(this,CapabilityImageQuery);
  if (impl->glsl_std450_ext == 0) {
    IVar3 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar3;
  }
  pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_78 = 0;
  feedback_id = Converter::Impl::get_id_for_value(impl,pVVar16,0);
  pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
  pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
  local_48 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&feedback_id);
  num_coords_full = 0;
  num_coords = 0;
  bVar2 = get_image_dimensions(impl,IVar3,&num_coords_full,&num_coords);
  bVar23 = num_coords == 2 && bVar2;
  if (num_coords != 2 || !bVar2) {
    return bVar23;
  }
  component = spv::Builder::makeBoolType(this);
  component_00 = spv::Builder::makeIntType(this,0x20);
  component_01 = spv::Builder::makeFloatType(this,0x20);
  type_id = spv::Builder::makeVectorType(this,component,2);
  type1 = spv::Builder::makeVectorType(this,component_00,2);
  type_id_00 = spv::Builder::makeVectorType(this,component_01,2);
  size = num_coords_full;
  if (num_coords_full == 3) {
    pOVar17 = Converter::Impl::allocate(impl,OpExtInst,component_01);
    Operation::add_id(pOVar17,impl->glsl_std450_ext);
    Operation::add_literal(pOVar17,2);
    pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
    IVar5 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
    Operation::add_id(pOVar17,IVar5);
    Converter::Impl::add(impl,pOVar17,false);
    pOVar18 = Converter::Impl::allocate(impl,OpConvertFToS,component_00);
    Operation::add_id(pOVar18,pOVar17->id);
    Converter::Impl::add(impl,pOVar18,false);
    local_78 = pOVar18->id;
  }
  for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
    pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)lVar24 | 4);
    IVar5 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
    coord_ids[lVar24] = IVar5;
  }
  IVar6 = Converter::Impl::build_vector(impl,component_01,coord_ids,2);
  IVar5 = feedback_id;
  pBVar19 = Converter::Impl::builder(impl);
  IVar7 = spv::Builder::makeIntType(pBVar19,0x20);
  IVar8 = spv::Builder::makeVectorType(pBVar19,IVar7,2);
  if (size == 3) {
    IVar9 = spv::Builder::makeVectorType(pBVar19,IVar7,3);
    pOVar18 = Converter::Impl::allocate(impl,OpImageQuerySize,IVar9);
    Operation::add_id(pOVar18,IVar5);
    Converter::Impl::add(impl,pOVar18,false);
    pOVar17 = Converter::Impl::allocate(impl,OpVectorShuffle,IVar8);
    Operation::add_id(pOVar17,pOVar18->id);
    Operation::add_id(pOVar17,pOVar18->id);
    Operation::add_literal(pOVar17,0);
    Operation::add_literal(pOVar17,1);
  }
  else {
    pOVar17 = Converter::Impl::allocate(impl,OpImageQuerySize,IVar8);
    Operation::add_id(pOVar17,IVar5);
  }
  local_dc = 0;
  Converter::Impl::add(impl,pOVar17,false);
  IVar5 = pOVar17->id;
  pOVar17 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar8);
  Operation::add_id(pOVar17,IVar5);
  IVar5 = spv::Builder::makeIntConstant(pBVar19,0xf,false);
  IVar5 = Converter::Impl::build_splat_constant_vector(impl,IVar7,IVar5,2);
  Operation::add_id(pOVar17,IVar5);
  Converter::Impl::add(impl,pOVar17,false);
  IVar5 = pOVar17->id;
  pBVar19 = Converter::Impl::builder(impl);
  IVar7 = spv::Builder::makeIntType(pBVar19,0x20);
  pOVar17 = Converter::Impl::allocate(impl,OpImageQueryLevels,IVar7);
  Operation::add_id(pOVar17,IVar3);
  Converter::Impl::add(impl,pOVar17,false);
  pOVar18 = Converter::Impl::allocate(impl,OpISub,IVar7);
  Operation::add_id(pOVar18,pOVar17->id);
  IVar7 = spv::Builder::makeIntConstant(pBVar19,1,false);
  Operation::add_id(pOVar18,IVar7);
  Converter::Impl::add(impl,pOVar18,false);
  IVar7 = pOVar18->id;
  pBVar19 = Converter::Impl::builder(impl);
  IVar8 = spv::Builder::makeFloatType(pBVar19,0x20);
  IVar9 = spv::Builder::makeVectorType(pBVar19,IVar8,2);
  OVar10 = opcode & ~TempRegStore;
  if (OVar10 == WriteSamplerFeedback) {
    local_dc = 0;
    IVar11 = Converter::Impl::build_sampled_image(impl,IVar3,IVar4,false);
    IVar4 = IVar6;
    if (opcode == WriteSamplerFeedbackBias) {
      pOVar17 = Converter::Impl::allocate(impl,OpExtInst,IVar8);
      Operation::add_id(pOVar17,impl->glsl_std450_ext);
      Operation::add_literal(pOVar17,0x1d);
      pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,8);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
      Operation::add_id(pOVar17,IVar4);
      Converter::Impl::add(impl,pOVar17,false);
      local_dc = pOVar17->id;
      pOVar18 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadBroadcast,IVar8);
      IVar4 = spv::Builder::makeUintConstant(pBVar19,3,false);
      Operation::add_id(pOVar18,IVar4);
      Operation::add_id(pOVar18,pOVar17->id);
      IVar4 = spv::Builder::makeUintConstant(pBVar19,0,false);
      Operation::add_id(pOVar18,IVar4);
      Converter::Impl::add(impl,pOVar18,false);
      spv::Builder::addCapability(pBVar19,CapabilityGroupNonUniformQuad);
      pOVar17 = Converter::Impl::allocate(impl,OpVectorTimesScalar,IVar9);
      Operation::add_id(pOVar17,IVar6);
      Operation::add_id(pOVar17,pOVar18->id);
      Converter::Impl::add(impl,pOVar17,false);
      IVar4 = pOVar17->id;
    }
    IVar9 = spv::Builder::makeVectorType(pBVar19,IVar8,2);
    pOVar17 = Converter::Impl::allocate(impl,OpImageQueryLod,IVar9);
    ddx = (Id  [2])local_50;
    local_50[0] = IVar11;
    local_50[1] = IVar4;
    Operation::add_ids(pOVar17,(initializer_list<unsigned_int> *)ddx);
    Converter::Impl::add(impl,pOVar17,false);
    pOVar18 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar8);
    Operation::add_id(pOVar18,pOVar17->id);
    Operation::add_literal(pOVar18,0);
    Converter::Impl::add(impl,pOVar18,false);
    IVar4 = pOVar18->id;
  }
  else {
    if (opcode == WriteSamplerFeedbackGrad) {
      pOVar17 = Converter::Impl::allocate(impl,OpConvertSToF,IVar9);
      IVar4 = spv::Builder::makeIntConstant(pBVar19,0,false);
      IVar4 = emit_query_size(impl,IVar3,size == 3,IVar4);
      Operation::add_id(pOVar17,IVar4);
      Converter::Impl::add(impl,pOVar17,false);
      for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
        pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)lVar24 | 8);
        IVar4 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
        ddx[lVar24] = IVar4;
        pVVar16 = LLVMBC::Instruction::getOperand
                            (&instruction->super_Instruction,(uint)lVar24 + 0xb);
        IVar4 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
        local_50[lVar24] = IVar4;
      }
      IVar4 = Converter::Impl::build_vector(impl,IVar8,ddx,2);
      IVar11 = Converter::Impl::build_vector(impl,IVar8,local_50,2);
      pOVar18 = Converter::Impl::allocate(impl,OpFMul,IVar9);
      Operation::add_id(pOVar18,pOVar17->id);
      Operation::add_id(pOVar18,IVar4);
      local_dc = 0;
      Converter::Impl::add(impl,pOVar18,false);
      pOVar20 = Converter::Impl::allocate(impl,OpFMul,IVar9);
      Operation::add_id(pOVar20,pOVar17->id);
      Operation::add_id(pOVar20,IVar11);
      Converter::Impl::add(impl,pOVar20,false);
      IVar4 = build_lod_from_gradient(impl,pOVar18->id,pOVar20->id);
      if (OVar10 != WriteSamplerFeedbackLevel) goto LAB_00162fd5;
    }
    else {
      IVar4 = 0;
      if (opcode != WriteSamplerFeedbackLevel) goto LAB_00163327;
      pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,8);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
    }
    pOVar17 = Converter::Impl::allocate(impl,OpConvertSToF,IVar8);
    Operation::add_id(pOVar17,IVar7);
    local_dc = 0;
    Converter::Impl::add(impl,pOVar17,false);
    pOVar18 = Converter::Impl::allocate(impl,OpExtInst,IVar8);
    Operation::add_id(pOVar18,impl->glsl_std450_ext);
    Operation::add_literal(pOVar18,0x51);
    Operation::add_id(pOVar18,IVar4);
    IVar4 = spv::Builder::makeFloatConstant(pBVar19,0.0,false);
    Operation::add_id(pOVar18,IVar4);
    Operation::add_id(pOVar18,pOVar17->id);
    Converter::Impl::add(impl,pOVar18,false);
    IVar4 = pOVar18->id;
    if (opcode == WriteSamplerFeedbackLevel) goto LAB_00163327;
  }
LAB_00162fd5:
  uVar12 = LLVMBC::Instruction::getNumOperands(&instruction->super_Instruction);
  pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar12 - 1);
  bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar16);
  if (!bVar2) {
    pOVar17 = Converter::Impl::allocate(impl,OpExtInst,IVar8);
    Operation::add_id(pOVar17,impl->glsl_std450_ext);
    Operation::add_literal(pOVar17,0x28);
    Operation::add_id(pOVar17,IVar4);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
    Operation::add_id(pOVar17,IVar4);
    Converter::Impl::add(impl,pOVar17,false);
    pOVar18 = Converter::Impl::allocate(impl,OpExtInst,IVar8);
    Operation::add_id(pOVar18,impl->glsl_std450_ext);
    Operation::add_literal(pOVar18,0x25);
    Operation::add_id(pOVar18,pOVar17->id);
    IVar4 = spv::Builder::makeFloatConstant(pBVar19,14.0,false);
    Operation::add_id(pOVar18,IVar4);
    Converter::Impl::add(impl,pOVar18,false);
    IVar4 = pOVar18->id;
  }
LAB_00163327:
  pBVar19 = Converter::Impl::builder(impl);
  IVar9 = spv::Builder::makeIntType(pBVar19,0x20);
  IVar11 = spv::Builder::makeFloatType(pBVar19,0x20);
  IVar13 = spv::Builder::makeBoolType(pBVar19);
  pOVar17 = Converter::Impl::allocate(impl,OpConvertFToS,IVar9);
  Operation::add_id(pOVar17,IVar4);
  Converter::Impl::add(impl,pOVar17,false);
  IVar8 = pOVar17->id;
  pOVar18 = Converter::Impl::allocate(impl,OpFAdd,IVar11);
  Operation::add_id(pOVar18,IVar4);
  IVar4 = spv::Builder::makeFloatConstant(pBVar19,0.9970703,false);
  Operation::add_id(pOVar18,IVar4);
  Converter::Impl::add(impl,pOVar18,false);
  pOVar20 = Converter::Impl::allocate(impl,OpConvertFToS,IVar9);
  Operation::add_id(pOVar20,pOVar18->id);
  Converter::Impl::add(impl,pOVar20,false);
  pOVar18 = Converter::Impl::allocate(impl,OpExtInst,IVar9);
  Operation::add_id(pOVar18,impl->glsl_std450_ext);
  Operation::add_literal(pOVar18,0x27);
  Operation::add_id(pOVar18,pOVar20->id);
  Operation::add_id(pOVar18,IVar7);
  Converter::Impl::add(impl,pOVar18,false);
  IVar4 = pOVar20->id;
  pOVar18 = Converter::Impl::allocate(impl,OpINotEqual,IVar13);
  Operation::add_id(pOVar18,pOVar17->id);
  Operation::add_id(pOVar18,pOVar20->id);
  Converter::Impl::add(impl,pOVar18,false);
  IVar7 = pOVar18->id;
  IVar9 = 0;
  if (OVar10 == WriteSamplerFeedback) {
    pBVar19 = Converter::Impl::builder(impl);
    IVar9 = spv::Builder::makeFloatType(pBVar19,0x20);
    IVar11 = spv::Builder::makeVectorType(pBVar19,IVar9,2);
    pOVar17 = Converter::Impl::allocate(impl,OpDPdx,IVar11);
    Operation::add_id(pOVar17,IVar6);
    Converter::Impl::add(impl,pOVar17,false);
    pOVar18 = Converter::Impl::allocate(impl,OpDPdy,IVar11);
    Operation::add_id(pOVar18,IVar6);
    Converter::Impl::add(impl,pOVar18,false);
    pOVar20 = Converter::Impl::allocate(impl,OpExtInst,IVar11);
    Operation::add_id(pOVar20,impl->glsl_std450_ext);
    Operation::add_literal(pOVar20,4);
    Operation::add_id(pOVar20,pOVar17->id);
    Converter::Impl::add(impl,pOVar20,false);
    pOVar17 = Converter::Impl::allocate(impl,OpExtInst,IVar11);
    Operation::add_id(pOVar17,impl->glsl_std450_ext);
    Operation::add_literal(pOVar17,4);
    Operation::add_id(pOVar17,pOVar18->id);
    Converter::Impl::add(impl,pOVar17,false);
    pOVar18 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar9);
    Operation::add_id(pOVar18,pOVar20->id);
    Operation::add_literal(pOVar18,0);
    Converter::Impl::add(impl,pOVar18,false);
    pOVar21 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar9);
    Operation::add_id(pOVar21,pOVar17->id);
    Operation::add_literal(pOVar21,0);
    Converter::Impl::add(impl,pOVar21,false);
    pOVar22 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar9);
    Operation::add_id(pOVar22,pOVar20->id);
    Operation::add_literal(pOVar22,1);
    Converter::Impl::add(impl,pOVar22,false);
    pOVar20 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar9);
    Operation::add_id(pOVar20,pOVar17->id);
    Operation::add_literal(pOVar20,1);
    Converter::Impl::add(impl,pOVar20,false);
    pOVar17 = Converter::Impl::allocate(impl,OpExtInst,IVar9);
    Operation::add_id(pOVar17,impl->glsl_std450_ext);
    Operation::add_literal(pOVar17,0x28);
    Operation::add_id(pOVar17,pOVar18->id);
    Operation::add_id(pOVar17,pOVar21->id);
    Converter::Impl::add(impl,pOVar17,false);
    pOVar18 = Converter::Impl::allocate(impl,OpExtInst,IVar9);
    Operation::add_id(pOVar18,impl->glsl_std450_ext);
    Operation::add_literal(pOVar18,0x28);
    Operation::add_id(pOVar18,pOVar22->id);
    Operation::add_id(pOVar18,pOVar20->id);
    Converter::Impl::add(impl,pOVar18,false);
    ddx[1] = pOVar18->id;
    ddx[0] = pOVar17->id;
    IVar9 = Converter::Impl::build_vector(impl,IVar9,ddx,2);
    if (local_dc != 0) {
      pOVar17 = Converter::Impl::allocate(impl,OpVectorTimesScalar,IVar11);
      Operation::add_id(pOVar17,IVar9);
      Operation::add_id(pOVar17,local_dc);
      Converter::Impl::add(impl,pOVar17,false);
      IVar9 = pOVar17->id;
    }
  }
  pOVar17 = Converter::Impl::allocate(impl,OpExtInst,type_id_00);
  Operation::add_id(pOVar17,impl->glsl_std450_ext);
  Operation::add_literal(pOVar17,10);
  Operation::add_id(pOVar17,IVar6);
  Converter::Impl::add(impl,pOVar17,false);
  for (iVar15 = 0; iVar15 != 2; iVar15 = iVar15 + 1) {
    IVar6 = IVar4;
    if (iVar15 == 0) {
      IVar6 = IVar8;
    }
    pBVar19 = Converter::Impl::builder(impl);
    IVar11 = spv::Builder::makeIntType(pBVar19,0x20);
    IVar11 = spv::Builder::makeVectorType(pBVar19,IVar11,2);
    IVar13 = spv::Builder::makeFloatType(pBVar19,0x20);
    IVar13 = spv::Builder::makeVectorType(pBVar19,IVar13,2);
    pOVar18 = Converter::Impl::allocate(impl,OpConvertSToF,IVar13);
    IVar14 = emit_query_size(impl,IVar3,size == 3,IVar6);
    Operation::add_id(pOVar18,IVar14);
    Converter::Impl::add(impl,pOVar18,false);
    pOVar20 = Converter::Impl::allocate(impl,OpSNegate,IVar11);
    Operation::add_id(pOVar20,IVar5);
    Converter::Impl::add(impl,pOVar20,false);
    pOVar21 = Converter::Impl::allocate(impl,OpExtInst,IVar13);
    Operation::add_id(pOVar21,impl->glsl_std450_ext);
    Operation::add_literal(pOVar21,0x35);
    Operation::add_id(pOVar21,pOVar18->id);
    Operation::add_id(pOVar21,pOVar20->id);
    Converter::Impl::add(impl,pOVar21,false);
    IVar11 = pOVar21->id;
    IVar13 = pOVar18->id;
    IVar14 = pOVar20->id;
    pOVar18 = Converter::Impl::allocate(impl,OpFMul,type_id_00);
    Operation::add_id(pOVar18,pOVar17->id);
    Operation::add_id(pOVar18,IVar11);
    Converter::Impl::add(impl,pOVar18,false);
    if (OVar10 == WriteSamplerFeedback) {
      pOVar20 = Converter::Impl::allocate(impl,OpFMul,type_id_00);
      Operation::add_id(pOVar20,IVar9);
      Operation::add_id(pOVar20,IVar13);
      Converter::Impl::add(impl,pOVar20,false);
      pOVar21 = Converter::Impl::allocate(impl,OpFSub,type_id_00);
      Operation::add_id(pOVar21,pOVar20->id);
      IVar11 = spv::Builder::makeFloatConstant(this,0.00390625,false);
      IVar11 = Converter::Impl::build_splat_constant_vector(impl,component_01,IVar11,2);
      Operation::add_id(pOVar21,IVar11);
      Converter::Impl::add(impl,pOVar21,false);
      IVar11 = spv::Builder::makeStructResultType(this,type_id_00,type1);
      pOVar20 = Converter::Impl::allocate(impl,OpExtInst,IVar11);
      Operation::add_id(pOVar20,impl->glsl_std450_ext);
      Operation::add_literal(pOVar20,0x34);
      Operation::add_id(pOVar20,pOVar21->id);
      Converter::Impl::add(impl,pOVar20,false);
      pOVar21 = Converter::Impl::allocate(impl,OpCompositeExtract,type1);
      Operation::add_id(pOVar21,pOVar20->id);
      Operation::add_literal(pOVar21,1);
      Converter::Impl::add(impl,pOVar21,false);
      pOVar20 = Converter::Impl::allocate(impl,OpExtInst,type1);
      Operation::add_id(pOVar20,impl->glsl_std450_ext);
      Operation::add_literal(pOVar20,0x2d);
      Operation::add_id(pOVar20,pOVar21->id);
      IVar11 = spv::Builder::makeIntConstant(this,0,false);
      IVar11 = Converter::Impl::build_splat_constant_vector(impl,component_00,IVar11,2);
      Operation::add_id(pOVar20,IVar11);
      IVar11 = spv::Builder::makeIntConstant(this,4,false);
      IVar11 = Converter::Impl::build_splat_constant_vector(impl,component_00,IVar11,2);
      Operation::add_id(pOVar20,IVar11);
      Converter::Impl::add(impl,pOVar20,false);
      pOVar21 = Converter::Impl::allocate(impl,OpIAdd,type1);
      Operation::add_id(pOVar21,pOVar20->id);
      Operation::add_id(pOVar21,IVar14);
      Converter::Impl::add(impl,pOVar21,false);
      pOVar22 = Converter::Impl::allocate(impl,OpExtInst,type_id_00);
      Operation::add_id(pOVar22,impl->glsl_std450_ext);
      Operation::add_literal(pOVar22,0x35);
      IVar11 = spv::Builder::makeFloatConstant(this,0.5,false);
      IVar11 = Converter::Impl::build_splat_constant_vector(impl,component_01,IVar11,2);
      Operation::add_id(pOVar22,IVar11);
      Operation::add_id(pOVar22,pOVar21->id);
      Converter::Impl::add(impl,pOVar22,false);
      pOVar20 = Converter::Impl::allocate(impl,OpExtInst,type_id_00);
      Operation::add_id(pOVar20,impl->glsl_std450_ext);
      Operation::add_literal(pOVar20,0x25);
      Operation::add_id(pOVar20,pOVar22->id);
      IVar11 = spv::Builder::makeFloatConstant(this,0.5,false);
      IVar14 = Converter::Impl::build_splat_constant_vector(impl,component_01,IVar11,2);
    }
    else {
      pOVar20 = Converter::Impl::allocate(impl,OpExtInst,type_id_00);
      Operation::add_id(pOVar20,impl->glsl_std450_ext);
      Operation::add_literal(pOVar20,0x35);
      IVar11 = spv::Builder::makeFloatConstant(this,0.5,false);
      IVar11 = Converter::Impl::build_splat_constant_vector(impl,component_01,IVar11,2);
      Operation::add_id(pOVar20,IVar11);
    }
    Operation::add_id(pOVar20,IVar14);
    Converter::Impl::add(impl,pOVar20,false);
    IVar11 = pOVar20->id;
    pOVar20 = Converter::Impl::allocate(impl,OpFSub,type_id_00);
    Operation::add_id(pOVar20,pOVar18->id);
    Operation::add_id(pOVar20,IVar11);
    Converter::Impl::add(impl,pOVar20,false);
    pOVar21 = Converter::Impl::allocate(impl,OpExtInst,type_id_00);
    Operation::add_id(pOVar21,impl->glsl_std450_ext);
    Operation::add_literal(pOVar21,0x28);
    Operation::add_id(pOVar21,pOVar20->id);
    IVar13 = spv::Builder::makeFloatConstant(this,0.0,false);
    IVar13 = Converter::Impl::build_splat_constant_vector(impl,component_01,IVar13,2);
    Operation::add_id(pOVar21,IVar13);
    Converter::Impl::add(impl,pOVar21,false);
    pOVar20 = Converter::Impl::allocate(impl,OpFAdd,type_id_00);
    Operation::add_id(pOVar20,pOVar18->id);
    Operation::add_id(pOVar20,IVar11);
    Converter::Impl::add(impl,pOVar20,false);
    pOVar18 = Converter::Impl::allocate(impl,OpConvertFToS,type1);
    Operation::add_id(pOVar18,pOVar21->id);
    Converter::Impl::add(impl,pOVar18,false);
    pOVar21 = Converter::Impl::allocate(impl,OpConvertFToS,type1);
    Operation::add_id(pOVar21,pOVar20->id);
    Converter::Impl::add(impl,pOVar21,false);
    pOVar20 = Converter::Impl::allocate(impl,OpINotEqual,type_id);
    pIVar25 = &pOVar18->id;
    Operation::add_id(pOVar20,pOVar18->id);
    Operation::add_id(pOVar20,pOVar21->id);
    Converter::Impl::add(impl,pOVar20,false);
    pOVar18 = Converter::Impl::allocate(impl,OpCompositeExtract,component);
    Operation::add_id(pOVar18,pOVar20->id);
    Operation::add_literal(pOVar18,0);
    Converter::Impl::add(impl,pOVar18,false);
    pOVar21 = Converter::Impl::allocate(impl,OpCompositeExtract,component);
    Operation::add_id(pOVar21,pOVar20->id);
    Operation::add_literal(pOVar21,1);
    Converter::Impl::add(impl,pOVar21,false);
    pOVar20 = Converter::Impl::allocate(impl,OpLogicalAnd,component);
    Operation::add_id(pOVar20,pOVar18->id);
    Operation::add_id(pOVar20,pOVar21->id);
    Converter::Impl::add(impl,pOVar20,false);
    ddx[1] = pOVar21->id;
    ddx[0] = pOVar18->id;
    IVar11 = spv::Builder::makeIntConstant(this,1,false);
    for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
      pOVar18 = Converter::Impl::allocate(impl,OpSelect,component_00);
      Operation::add_id(pOVar18,ddx[lVar24]);
      IVar13 = spv::Builder::makeIntConstant(this,2 << ((byte)lVar24 & 0x1f),false);
      Operation::add_id(pOVar18,IVar13);
      IVar13 = spv::Builder::makeIntConstant(this,0,false);
      Operation::add_id(pOVar18,IVar13);
      Converter::Impl::add(impl,pOVar18,false);
      pOVar20 = Converter::Impl::allocate(impl,OpBitwiseOr,component_00);
      Operation::add_id(pOVar20,IVar11);
      Operation::add_id(pOVar20,pOVar18->id);
      Converter::Impl::add(impl,pOVar20,false);
      IVar11 = pOVar20->id;
    }
    IVar13 = spv::Builder::makeUintType(this,0x40);
    pOVar18 = Converter::Impl::allocate(impl,OpSConvert,IVar13);
    Operation::add_id(pOVar18,IVar11);
    Converter::Impl::add(impl,pOVar18,false);
    pOVar20 = Converter::Impl::allocate(impl,OpIMul,component_00);
    Operation::add_id(pOVar20,IVar6);
    IVar6 = spv::Builder::makeIntConstant(this,4,false);
    Operation::add_id(pOVar20,IVar6);
    Converter::Impl::add(impl,pOVar20,false);
    pOVar21 = Converter::Impl::allocate(impl,OpSConvert,IVar13);
    Operation::add_id(pOVar21,pOVar20->id);
    Converter::Impl::add(impl,pOVar21,false);
    pOVar20 = Converter::Impl::allocate(impl,OpShiftLeftLogical,IVar13);
    Operation::add_id(pOVar20,pOVar18->id);
    Operation::add_id(pOVar20,pOVar21->id);
    Converter::Impl::add(impl,pOVar20,false);
    if (local_78 != 0) {
      IVar6 = spv::Builder::makeVectorType(this,component_00,size);
      pOVar18 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar6);
      Operation::add_id(pOVar18,*pIVar25);
      Operation::add_id(pOVar18,local_78);
      Converter::Impl::add(impl,pOVar18,false);
      pIVar25 = &pOVar18->id;
    }
    IVar6 = *pIVar25;
    if (impl->execution_model == ExecutionModelFragment) {
      pOVar18 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,component);
      Converter::Impl::add(impl,pOVar18,false);
      pOVar21 = Converter::Impl::allocate(impl,OpLogicalNot,component);
      Operation::add_id(pOVar21,pOVar18->id);
      Converter::Impl::add(impl,pOVar21,false);
      IVar11 = pOVar21->id;
      if (iVar15 != 0) {
        pOVar18 = Converter::Impl::allocate(impl,OpLogicalAnd,component);
        Operation::add_id(pOVar18,IVar11);
        Operation::add_id(pOVar18,IVar7);
        Converter::Impl::add(impl,pOVar18,false);
        IVar11 = pOVar18->id;
      }
    }
    else {
      IVar11 = IVar7;
      if (iVar15 == 0) {
        IVar11 = spv::Builder::makeBoolConstant(this,true,false);
      }
    }
    pmVar1 = local_48;
    IVar13 = SPIRVModule::get_helper_call_id
                       (impl->spirv_module,
                        (uint)(size == 3) + (local_48->non_uniform & 1) * 2 + AtomicImageR64Compact,
                        0);
    IVar14 = spv::Builder::makeVoidType(this);
    pOVar18 = Converter::Impl::allocate(impl,OpFunctionCall,IVar14);
    Operation::add_id(pOVar18,IVar13);
    Operation::add_id(pOVar18,pmVar1->var_id);
    Operation::add_id(pOVar18,IVar6);
    Operation::add_id(pOVar18,pOVar20->id);
    Operation::add_id(pOVar18,IVar11);
    Converter::Impl::add(impl,pOVar18,false);
  }
  return bVar23;
}

Assistant:

bool emit_write_sampler_feedback_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityImageQuery);
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id feedback_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(3));
	const auto &meta = impl.handle_to_resource_meta[feedback_id];

	uint32_t num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Should not happen.
	if (num_coords != 2)
		return false;

	spv::Id bool_type = builder.makeBoolType();
	spv::Id i32_type = builder.makeIntType(32);
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id bvec_type = builder.makeVectorType(bool_type, 2);
	spv::Id ivec_type = builder.makeVectorType(i32_type, 2);
	spv::Id fvec_type = builder.makeVectorType(f32_type, 2);

	spv::Id int_layer_id = 0;
	if (num_coords_full == 3)
	{
		// Vulkan allows for two implementation of this rounding, either RTE or floor(v + 0.5).
		// Pick the suggested one. This matches real-world implementations.
		auto *rounded_layer = impl.allocate(spv::OpExtInst, f32_type);
		rounded_layer->add_id(impl.glsl_std450_ext);
		rounded_layer->add_literal(GLSLstd450RoundEven);
		rounded_layer->add_id(impl.get_id_for_value(instruction->getOperand(6)));
		impl.add(rounded_layer);

		auto *int_layer = impl.allocate(spv::OpConvertFToS, i32_type);
		int_layer->add_id(rounded_layer->id);
		impl.add(int_layer);

		int_layer_id = int_layer->id;
	}

	spv::Id coord_ids[2];
	for (uint32_t i = 0; i < 2; i++)
		coord_ids[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
	spv::Id coord_id = impl.build_vector(f32_type, coord_ids, 2);
	spv::Id mip_region_size_log2 = emit_mip_region_size_log2(impl, instruction, feedback_id, num_coords_full == 3);
	spv::Id max_level_id = emit_max_level(impl, image_id);

	// This part will change quite dramatically based on op-code.
	// Computing the actual LOD to access is quite painful.
	// We cannot do it properly for most interesting cases without having side band information
	// about sampler state. In real-world scenarios, applications will likely adhere to whatever mip level
	// we decide to access either way, so it shouldn't lead to serious problems.
	spv::Id grad_scale_id;
	spv::Id access_lod_id = emit_accessed_lod(opcode, impl, instruction, image_id, sampler_id, coord_id,
	                                          max_level_id, &grad_scale_id, num_coords_full == 3);

	auto lods = emit_trilinear_lods(impl, access_lod_id, max_level_id);

	spv::Id normalized_grad_extent = 0;
	if (opcode == DXIL::Op::WriteSamplerFeedback || opcode == DXIL::Op::WriteSamplerFeedbackBias)
		normalized_grad_extent = emit_gradient_extent_normalized(impl, coord_id, grad_scale_id);

	// Assume that if we get coordinates above 1.0 we intend to WRAP.
	// Only WRAP and CLAMP is supported with sampler feedback (but WRAP is kinda broken on NV hardware).
	// After wrap, assume CLAMP semantics for purposes of filtering.
	auto *fract_uv_op = impl.allocate(spv::OpExtInst, fvec_type);
	fract_uv_op->add_id(impl.glsl_std450_ext);
	fract_uv_op->add_literal(GLSLstd450Fract);
	fract_uv_op->add_id(coord_id);
	impl.add(fract_uv_op);

	for (unsigned lod_iteration = 0; lod_iteration < 2; lod_iteration++)
	{
		spv::Id lod_id = lod_iteration ? lods.coarse_lod_id : lods.fine_lod_id;

		auto scaling = emit_scaling_factor_to_mip_region_space(
			impl, instruction, image_id, lod_id,
			mip_region_size_log2, num_coords_full == 3);

		auto *mul_mip_region_coord = impl.allocate(spv::OpFMul, fvec_type);
		mul_mip_region_coord->add_id(fract_uv_op->id);
		mul_mip_region_coord->add_id(scaling.normalized_scale_id);
		impl.add(mul_mip_region_coord);

		// We have to assume the worst w.r.t. filtering / aniso.
		// Simplify this with a ton with crude, but effective approximations.
		// Compute derivatives in mip region space.
		// Based on these derivatives, we get a bounding box.
		// The size of this bounding box is then clamped to a minimum and maximum size.
		// At minimum, we have 1x aniso / bilinear. Extent is +/- 0.5 texels.
		// At maximum, we have 16x aniso. Extent is +/- 8 texels.
		// Need to look at derivatives so that we can compute conservative aniso extent.

		// For implicit LOD, we compute the gradient and try to recover aniso information.
		spv::Id clamped_extent_id;

		if (opcode == DXIL::Op::WriteSamplerFeedback || opcode == DXIL::Op::WriteSamplerFeedbackBias)
		{
			auto *scale_size = impl.allocate(spv::OpFMul, fvec_type);
			scale_size->add_id(normalized_grad_extent);
			scale_size->add_id(scaling.float_size_id);
			impl.add(scale_size);

			// For integer LODs, we will end up computing an approximate integer due to FP derivatives.
			// It would be very bad if we got a positive error and rounded up a full POT.
			// LODs tend to be snapped to fixed point, so use a sufficient threshold to avoid these errors.
			// This value is chosen somewhat arbitrarily, but one subtexel worth of bias seems reasonable.
			auto *rounding_bias = impl.allocate(spv::OpFSub, fvec_type);
			rounding_bias->add_id(scale_size->id);
			rounding_bias->add_id(
				impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(1.0f / 256.0f), 2));
			impl.add(rounding_bias);

			// With aniso factors, implementations are allowed to round up the aniso factor
			// to nearest supported value.
			// From exhaustive testing, NV and Intel have somewhat different behavior, but in general,
			// all POT factors behave accurately with this implementation.
			// Oddly enough, the extent is enlongated as well when rounding up, which is also not spec compliant ...
			// What we want to do is round up to next POT and round up extent similarly,
			// and the cutest way to do this is with frexp. The exponent represents next POT in magnitude.
			// We can then clamp that frexp to [unormalized_exponent_id, unnormalized_exponent_id + 4].
			// We're robust against NaN since the exponent is undefined, but we'll clamp that below in integer space.
			auto *frexp = impl.allocate(spv::OpExtInst, builder.makeStructResultType(fvec_type, ivec_type));
			frexp->add_id(impl.glsl_std450_ext);
			frexp->add_literal(GLSLstd450FrexpStruct);
			frexp->add_id(rounding_bias->id);
			impl.add(frexp);

			auto *extract = impl.allocate(spv::OpCompositeExtract, ivec_type);
			extract->add_id(frexp->id);
			extract->add_literal(1);
			impl.add(extract);

			auto *sclamp = impl.allocate(spv::OpExtInst, ivec_type);
			sclamp->add_id(impl.glsl_std450_ext);
			sclamp->add_literal(GLSLstd450SClamp);
			sclamp->add_id(extract->id);
			sclamp->add_id(impl.build_splat_constant_vector(i32_type, builder.makeIntConstant(0), num_coords));
			sclamp->add_id(impl.build_splat_constant_vector(i32_type, builder.makeIntConstant(4), num_coords));
			impl.add(sclamp);

			auto *shift_exp = impl.allocate(spv::OpIAdd, ivec_type);
			shift_exp->add_id(sclamp->id);
			shift_exp->add_id(scaling.unnormalized_exponent_id);
			impl.add(shift_exp);

			// For aniso, the conservative filter extent is half the major length.
			// Halve the bounding box extents as a rough approximation.
			// For bilinear, the footprint can be found in [-0.5, 0.5] texels.
			// Fuse the multiply and exp2() here in ldexp.
			auto *fextent = impl.allocate(spv::OpExtInst, fvec_type);
			fextent->add_id(impl.glsl_std450_ext);
			fextent->add_literal(GLSLstd450Ldexp);
			fextent->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			fextent->add_id(shift_exp->id);
			impl.add(fextent);

			// We only support signalling access for nearest neighbor.
			// For 16x aniso with 4x4 region, this can go wrong, but we don't really care.
			// Worst case, we can clamp to 16x16 region internally and upsample the region map on resolve.
			// Maximum +/- 0.5 regions is allowed here, this ensures that we access maximum 2x2 blocks.
			auto *clamped_extent = impl.allocate(spv::OpExtInst, fvec_type);
			clamped_extent->add_id(impl.glsl_std450_ext);
			clamped_extent->add_literal(GLSLstd450FMin);
			clamped_extent->add_id(fextent->id);
			clamped_extent->add_id(
				impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			impl.add(clamped_extent);

			clamped_extent_id = clamped_extent->id;
		}
		else
		{
			// Level is incompatible with aniso, so always assume simple bilinear. Use fixed +/- 0.5 pixel footprint.
			// For explicit gradient, we also assume no aniso,
			// since computing aniso-factors can cause far too fine mips to be requested if this was not intended by app.
			// We have no good way to detect this, and trying to compute aniso factors
			// accurately to hardware is a losing game since every implementation applies heavy approximations.
			auto *min_extent = impl.allocate(spv::OpExtInst, fvec_type);
			min_extent->add_id(impl.glsl_std450_ext);
			min_extent->add_literal(GLSLstd450Ldexp);
			min_extent->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			min_extent->add_id(scaling.unnormalized_exponent_id);
			impl.add(min_extent);

			clamped_extent_id = min_extent->id;
		}

		auto *lo_foot_print = impl.allocate(spv::OpFSub, fvec_type);
		lo_foot_print->add_id(mul_mip_region_coord->id);
		lo_foot_print->add_id(clamped_extent_id);
		impl.add(lo_foot_print);

		auto *lo_clamped = impl.allocate(spv::OpExtInst, fvec_type);
		lo_clamped->add_id(impl.glsl_std450_ext);
		lo_clamped->add_literal(GLSLstd450FMax);
		lo_clamped->add_id(lo_foot_print->id);
		lo_clamped->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.0f), num_coords));
		impl.add(lo_clamped);

		auto *hi_foot_print = impl.allocate(spv::OpFAdd, fvec_type);
		hi_foot_print->add_id(mul_mip_region_coord->id);
		hi_foot_print->add_id(clamped_extent_id);
		impl.add(hi_foot_print);

		auto *lo_int = impl.allocate(spv::OpConvertFToS, ivec_type);
		lo_int->add_id(lo_clamped->id);
		impl.add(lo_int);

		auto *hi_int = impl.allocate(spv::OpConvertFToS, ivec_type);
		hi_int->add_id(hi_foot_print->id);
		impl.add(hi_int);

		auto *not_equal = impl.allocate(spv::OpINotEqual, bvec_type);
		not_equal->add_id(lo_int->id);
		not_equal->add_id(hi_int->id);
		impl.add(not_equal);

		auto *visit_horiz = impl.allocate(spv::OpCompositeExtract, bool_type);
		visit_horiz->add_id(not_equal->id);
		visit_horiz->add_literal(0);
		impl.add(visit_horiz);

		auto *visit_vert = impl.allocate(spv::OpCompositeExtract, bool_type);
		visit_vert->add_id(not_equal->id);
		visit_vert->add_literal(1);
		impl.add(visit_vert);

		auto *visit_diag = impl.allocate(spv::OpLogicalAnd, bool_type);
		visit_diag->add_id(visit_horiz->id);
		visit_diag->add_id(visit_vert->id);
		impl.add(visit_diag);

		const spv::Id bit_ids[3] = {visit_horiz->id, visit_vert->id, visit_diag->id};
		spv::Id merged_bit = builder.makeIntConstant(1);

		for (unsigned i = 0; i < 3; i++)
		{
			auto *select_op = impl.allocate(spv::OpSelect, i32_type);
			select_op->add_id(bit_ids[i]);
			select_op->add_id(builder.makeIntConstant(2 << i));
			select_op->add_id(builder.makeIntConstant(0));
			impl.add(select_op);

			auto *or_op = impl.allocate(spv::OpBitwiseOr, i32_type);
			or_op->add_id(merged_bit);
			or_op->add_id(select_op->id);
			impl.add(or_op);

			merged_bit = or_op->id;
		}

		spv::Id u64_type = builder.makeUintType(64);
		auto *u64_conv = impl.allocate(spv::OpSConvert, u64_type);
		u64_conv->add_id(merged_bit);
		impl.add(u64_conv);

		auto *shamt = impl.allocate(spv::OpIMul, i32_type);
		shamt->add_id(lod_id);
		shamt->add_id(builder.makeIntConstant(4));
		impl.add(shamt);

		auto *shamt64 = impl.allocate(spv::OpSConvert, u64_type);
		shamt64->add_id(shamt->id);
		impl.add(shamt64);

		auto *shift_op = impl.allocate(spv::OpShiftLeftLogical, u64_type);
		shift_op->add_id(u64_conv->id);
		shift_op->add_id(shamt64->id);
		impl.add(shift_op);

		spv::Id comp_id;
		if (int_layer_id)
		{
			auto *comp = impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(i32_type, num_coords_full));
			comp->add_id(lo_int->id);
			comp->add_id(int_layer_id);
			impl.add(comp);
			comp_id = comp->id;
		}
		else
		{
			comp_id = lo_int->id;
		}

		spv::Id participate_id;
		if (impl.execution_model == spv::ExecutionModelFragment)
		{
			auto *is_helper = impl.allocate(spv::OpIsHelperInvocationEXT, bool_type);
			impl.add(is_helper);

			auto *not_op = impl.allocate(spv::OpLogicalNot, bool_type);
			not_op->add_id(is_helper->id);
			impl.add(not_op);

			participate_id = not_op->id;

			if (lod_iteration != 0)
			{
				auto *trilinear_and = impl.allocate(spv::OpLogicalAnd, bool_type);
				trilinear_and->add_id(participate_id);
				trilinear_and->add_id(lods.trilinear_enable_id);
				impl.add(trilinear_and);
				participate_id = trilinear_and->id;
			}
		}
		else
		{
			if (lod_iteration == 0)
				participate_id = builder.makeBoolConstant(true);
			else
				participate_id = lods.trilinear_enable_id;
		}

		HelperCall helper_call;
		if (num_coords_full == 3 && meta.non_uniform)
			helper_call = HelperCall::AtomicImageArrayR64CompactNonUniform;
		else if (num_coords_full == 3)
			helper_call = HelperCall::AtomicImageArrayR64Compact;
		else if (meta.non_uniform)
			helper_call = HelperCall::AtomicImageR64CompactNonUniform;
		else
			helper_call = HelperCall::AtomicImageR64Compact;

		spv::Id call_id = impl.spirv_module.get_helper_call_id(helper_call);
		auto *call = impl.allocate(spv::OpFunctionCall, builder.makeVoidType());
		call->add_id(call_id);
		call->add_id(meta.var_id);
		call->add_id(comp_id);
		call->add_id(shift_op->id);
		call->add_id(participate_id);
		impl.add(call);
	}

	return true;
}